

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int INT_EVdfg_realize(EVdfg dfg)

{
  long in_RDI;
  EVmaster in_stack_00000048;
  EVdfg_configuration in_stack_00000050;
  
  check_connectivity(in_stack_00000050,in_stack_00000048);
  if (*(int *)(in_RDI + 0x20) == 1) {
    *(undefined4 *)(*(long *)(in_RDI + 8) + 0x50) = 0;
  }
  *(undefined4 *)(in_RDI + 0x20) = 1;
  return 1;
}

Assistant:

extern int
INT_EVdfg_realize(EVdfg dfg)
{
    check_connectivity(dfg->working_state, dfg->master);
//    check_types(dfg);

    if (dfg->realized == 1) {
	dfg->master->reconfig = 0;
    }
    dfg->realized = 1;
    return 1;
}